

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O2

size_t __thiscall
bv::internal::bt_impl<2048UL,_(bv::allocation_policy_t)0>::alloc_node
          (bt_impl<2048UL,_(bv::allocation_policy_t)0> *this)

{
  size_t nodes;
  size_t sVar1;
  
  sVar1 = this->free_node;
  nodes = sVar1 + 1;
  this->free_node = nodes;
  reserve_nodes(this,nodes);
  return sVar1;
}

Assistant:

size_t bt_impl<W, AP>::alloc_node() {
            assert(used_nodes() < nodes_count &&
                   "Maximum number of nodes exceeded");
            
            size_t node = free_node++;
            
            if(AP == alloc_on_demand)
                reserve_nodes(used_nodes());
            
            return node;
        }